

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O3

int __thiscall libchess::Position::see_for(Position *this,Move move,array<int,_6UL> piece_values)

{
  ulong uVar1;
  pointer pcVar2;
  array<int,_6UL> piece_values_00;
  uint uVar3;
  int iVar4;
  array<int,_6UL> *paVar5;
  undefined8 uVar6;
  ulong uVar7;
  Square to_square;
  Square square;
  ulong uVar8;
  long lVar9;
  Position *pPVar10;
  int iVar11;
  value_type *pvVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  Position pos;
  undefined1 local_b8 [104];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  square.super_MetaValueType<int>.value_ = (MetaValueType<int>)((uint)move.value_ >> 6 & 0x3f);
  if (((uint)move.value_ >> 0xf & 7) == 0) {
    lVar9 = 0;
    do {
      iVar11 = *(int *)((long)&constants::PIECE_TYPES + lVar9);
      uVar8 = this->piece_type_bb_[iVar11].value_ & 1L << (sbyte)(move.value_ & 0x3fU);
      if (uVar8 != 0) goto LAB_00114450;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x18);
    iVar11 = 0;
LAB_00114450:
    uVar7 = 1L << (sbyte)square.super_MetaValueType<int>.value_;
    lVar9 = 0;
    do {
      uVar1 = this->piece_type_bb_[*(int *)((long)&constants::PIECE_TYPES + lVar9)].value_;
      if ((uVar1 & uVar7) != 0) break;
      bVar14 = lVar9 != 0x14;
      lVar9 = lVar9 + 4;
    } while (bVar14);
    uVar3 = (uint)move.value_ >> 0xc & 7;
    if ((uVar3 == 5) || (uVar3 == 0)) {
      bVar14 = false;
      if (((uVar1 & uVar7) == 0) && ((uVar8 != 0 && (iVar11 == 0)))) {
        iVar13 = (int)square.super_MetaValueType<int>.value_ - (move.value_ & 0x3fU);
        iVar11 = -iVar13;
        if (0 < iVar13) {
          iVar11 = iVar13;
        }
        if ((iVar11 != 9) && (iVar11 != 7)) goto LAB_001144b0;
        bVar14 = true;
      }
    }
    else {
LAB_001144b0:
      bVar14 = false;
    }
  }
  else {
    bVar14 = ((byte)((uint)move.value_ >> 0xf) & 7) == 3;
  }
  uVar8 = 1L << (sbyte)square.super_MetaValueType<int>.value_;
  lVar9 = 0;
  do {
    uVar3 = *(uint *)((long)&constants::PIECE_TYPES + lVar9);
    uVar7 = this->piece_type_bb_[(int)uVar3].value_;
    if ((uVar7 & uVar8) != 0) goto LAB_001144ef;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x18);
  uVar3 = 0;
LAB_001144ef:
  lVar9 = 0;
  do {
    uVar1 = this->color_bb_[*(int *)((long)&constants::COLORS + lVar9)].value_;
    if ((uVar1 & uVar8) != 0) break;
    bVar15 = lVar9 != 4;
    lVar9 = lVar9 + 4;
  } while (bVar15);
  bVar15 = (uVar1 & uVar8) == 0;
  if (bVar15) {
    uVar3 = 0;
  }
  bVar16 = (uVar7 & uVar8) == 0;
  if (bVar16) {
    uVar3 = 0;
  }
  iVar11 = 0;
  if (!(bool)(~bVar14 & (bVar16 || bVar15))) {
    paVar5 = &piece_values;
    if (!bVar14) {
      uVar8 = (ulong)(uVar3 & 7);
      if (5 < uVar8) goto LAB_0011464e;
      paVar5 = (array<int,_6UL> *)((long)piece_values._M_elems + uVar8 * 4);
    }
    iVar13 = paVar5->_M_elems[0];
    uVar3 = (uint)move.value_ >> 0xc & 7;
    if ((((uint)move.value_ >> 0xc & 7) != 0) && (uVar3 != 5)) {
      uVar8 = (ulong)uVar3;
      if (5 < uVar3) {
LAB_0011464e:
        uVar6 = std::__throw_out_of_range_fmt
                          ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar8,6);
        ~Position((Position *)local_b8);
        _Unwind_Resume(uVar6);
      }
      iVar13 = (iVar13 + *(int *)((long)piece_values._M_elems + uVar8 * 4)) -
               piece_values._M_elems[0];
    }
    pPVar10 = this;
    pvVar12 = (value_type *)local_b8;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      *pvVar12 = pPVar10->piece_type_bb_[0].value_;
      pPVar10 = (Position *)(pPVar10->piece_type_bb_ + 1);
      pvVar12 = pvVar12 + 1;
    }
    local_b8._72_4_ = this->ply_;
    std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::vector
              ((vector<libchess::Position::State,_std::allocator<libchess::Position::State>_> *)
               (local_b8 + 0x50),&this->history_);
    pcVar2 = (this->start_fen_)._M_dataplus._M_p;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (this->start_fen_)._M_string_length);
    make_move((Position *)local_b8,move);
    piece_values_00._M_elems[1] = piece_values._M_elems[1];
    piece_values_00._M_elems[0] = piece_values._M_elems[0];
    piece_values_00._M_elems[2] = piece_values._M_elems[2];
    piece_values_00._M_elems[3] = piece_values._M_elems[3];
    piece_values_00._M_elems[4] = piece_values._M_elems[4];
    piece_values_00._M_elems[5] = piece_values._M_elems[5];
    iVar4 = see_to((Position *)local_b8,square,piece_values_00);
    iVar11 = 0;
    if (0 < iVar13 - iVar4) {
      iVar11 = iVar13 - iVar4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((pointer)local_b8._80_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._80_8_,local_b8._96_8_ - local_b8._80_8_);
    }
  }
  return iVar11;
}

Assistant:

inline int Position::see_for(Move move, std::array<int, 6> piece_values) {
    bool is_enpassant = move_type_of(move) == Move::Type::ENPASSANT;

    auto square_pt = piece_on(move.to_square());
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto move_prom_piece_type = move.promotion_piece_type();
    if (move_prom_piece_type) {
        piece_val += piece_values.at(move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(move);
    return std::max(0, piece_val - pos.see_to(move.to_square(), piece_values));
}